

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

void __thiscall
QArrayDataPointer<QString>::detachAndGrow
          (QArrayDataPointer<QString> *this,GrowthPosition where,qsizetype n,QString **data,
          QArrayDataPointer<QString> *old)

{
  bool bVar1;
  long lVar2;
  
  if ((this->d == (Data *)0x0) ||
     (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i))
  goto LAB_0011cb36;
  if (n == 0) {
    return;
  }
  if (where == GrowsAtEnd) {
    lVar2 = freeSpaceAtEnd(this);
LAB_0011cb71:
    if (n <= lVar2) {
      return;
    }
  }
  else if (where == GrowsAtBeginning) {
    lVar2 = freeSpaceAtBegin(this);
    goto LAB_0011cb71;
  }
  bVar1 = tryReadjustFreeSpace(this,where,n,data);
  if (bVar1) {
    return;
  }
LAB_0011cb36:
  reallocateAndGrow(this,where,n,old);
  return;
}

Assistant:

void detachAndGrow(QArrayData::GrowthPosition where, qsizetype n, const T **data,
                       QArrayDataPointer *old)
    {
        const bool detach = needsDetach();
        bool readjusted = false;
        if (!detach) {
            if (!n || (where == QArrayData::GrowsAtBeginning && freeSpaceAtBegin() >= n)
                || (where == QArrayData::GrowsAtEnd && freeSpaceAtEnd() >= n))
                return;
            readjusted = tryReadjustFreeSpace(where, n, data);
            Q_ASSERT(!readjusted
                     || (where == QArrayData::GrowsAtBeginning && freeSpaceAtBegin() >= n)
                     || (where == QArrayData::GrowsAtEnd && freeSpaceAtEnd() >= n));
        }

        if (!readjusted)
            reallocateAndGrow(where, n, old);
    }